

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  char c;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  undefined4 uVar11;
  DateTime x;
  sqlite3_str sRes;
  DateTime y;
  DateTime local_c0;
  sqlite3_context *local_90;
  sqlite3_str local_88;
  DateTime local_68;
  
  if (((argc != 0) && (pvVar6 = sqlite3ValueText(*argv,'\x01'), pvVar6 != (void *)0x0)) &&
     (iVar4 = isDate(context,argc + -1,argv + 1,&local_c0), iVar4 == 0)) {
    local_88.mxAlloc = context->pOut->db->aLimit[0];
    local_88.nAlloc = 0;
    local_88.db = (sqlite3 *)0x0;
    local_88.zText = (char *)0x0;
    local_88.nChar = 0;
    local_88.accError = '\0';
    local_88.printfFlags = '\0';
    local_90 = context;
    computeJD(&local_c0);
    computeYMD(&local_c0);
    computeHMS(&local_c0);
    uVar8 = 0;
    uVar10 = 0;
    while( true ) {
      if (*(char *)((long)pvVar6 + uVar10) != '%') break;
      if (uVar8 < uVar10) {
        sqlite3_str_append(&local_88,(char *)((long)pvVar6 + uVar8),(int)uVar10 - (int)uVar8);
      }
      uVar7 = uVar10 + 1;
      bVar1 = *(byte *)((long)pvVar6 + uVar10 + 1);
      uVar8 = uVar10 + 2;
      uVar10 = uVar7;
      if (bVar1 < 100) {
        if (bVar1 < 0x4d) {
          if (bVar1 == 0x25) {
            c = '%';
            goto LAB_001bbad6;
          }
          if (bVar1 != 0x48) {
            if (bVar1 != 0x4a) goto switchD_001bb8e4_caseD_65;
            uVar11 = SUB84((double)local_c0.iJD / 86400000.0,0);
            pcVar9 = "%.16g";
            goto LAB_001bbab0;
          }
          uVar7 = (ulong)(uint)local_c0.h;
        }
        else {
          if (0x56 < bVar1) {
            if (bVar1 == 0x57) goto switchD_001bb8e4_caseD_6a;
            if (bVar1 != 0x59) goto switchD_001bb8e4_caseD_65;
            uVar7 = (ulong)(uint)local_c0.Y;
            pcVar9 = "%04d";
            goto LAB_001bbaf1;
          }
          if (bVar1 == 0x4d) {
            uVar7 = (ulong)(uint)local_c0.m;
          }
          else {
            if (bVar1 != 0x53) goto switchD_001bb8e4_caseD_65;
            uVar7 = (ulong)(uint)(int)local_c0.s;
          }
        }
        goto LAB_001bbae7;
      }
      switch(bVar1) {
      case 100:
        uVar7 = (ulong)(uint)local_c0.D;
        goto LAB_001bbae7;
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6b:
      case 0x6c:
switchD_001bb8e4_caseD_65:
        if ((local_88._28_2_ & 0x400) == 0) {
          return;
        }
        if (local_88.zText == (char *)0x0) {
          return;
        }
        sqlite3DbFreeNN(local_88.db,local_88.zText);
        return;
      case 0x66:
        uVar11 = 0x3b645a1d;
        if (local_c0.s <= 59.999) {
          uVar11 = SUB84(local_c0.s,0);
        }
        pcVar9 = "%06.3f";
LAB_001bbab0:
        sqlite3_str_appendf(&local_88,pcVar9,uVar11);
        break;
      case 0x6a:
switchD_001bb8e4_caseD_6a:
        local_68.s = local_c0.s;
        local_68.iJD = local_c0.iJD;
        local_68._40_8_ = local_c0._40_8_ & 0xffffffffffffff00;
        local_68.M = 1;
        local_68.Y = local_c0.Y;
        local_68.h = local_c0.h;
        local_68.D = 1;
        computeJD(&local_68);
        auVar2 = SEXT816((local_c0.iJD + 43200000) - local_68.iJD) * SEXT816(0x636ba875fd33dc87);
        iVar4 = (int)(auVar2._8_8_ >> 0x19) - (auVar2._12_4_ >> 0x1f);
        if (bVar1 == 0x57) {
          lVar3 = (local_c0.iJD + 43200000) / 86400000;
          auVar2 = SEXT816(lVar3) * SEXT816(0x4924924924924925);
          iVar5 = ((int)(auVar2._8_8_ >> 1) - (auVar2._12_4_ >> 0x1f)) * 7 - (int)lVar3;
          iVar4 = (int)((ulong)((long)(iVar4 + iVar5 + 7) * -0x6db6db6d) >> 0x20) + iVar5 + iVar4 +
                  7;
          uVar7 = (ulong)(uint)((iVar4 >> 2) - (iVar4 >> 0x1f));
          goto LAB_001bbae7;
        }
        pcVar9 = "%03d";
        uVar7 = (ulong)(iVar4 + 1);
        goto LAB_001bbaf1;
      case 0x6d:
        uVar7 = (ulong)(uint)local_c0.M;
LAB_001bbae7:
        pcVar9 = "%02d";
LAB_001bbaf1:
        sqlite3_str_appendf(&local_88,pcVar9,uVar7);
        break;
      default:
        if (bVar1 == 0x73) {
          sqlite3_str_appendf(&local_88,"%lld",local_c0.iJD / 1000 + -0x3118a36940);
        }
        else {
          if (bVar1 != 0x77) goto switchD_001bb8e4_caseD_65;
          lVar3 = (local_c0.iJD + 0x7b98a00) / 86400000;
          auVar2 = SEXT816(lVar3) * SEXT816(0x4924924924924925);
          c = (char)lVar3 + ((char)(auVar2._8_4_ >> 1) - (auVar2[0xf] >> 7)) * -7 + '0';
LAB_001bbad6:
          sqlite3_str_appendchar(&local_88,1,c);
        }
      }
LAB_001bbafb:
      uVar10 = uVar10 + 1;
    }
    if (*(char *)((long)pvVar6 + uVar10) != '\0') goto LAB_001bbafb;
    if (uVar8 < uVar10) {
      sqlite3_str_append(&local_88,(char *)((long)pvVar6 + uVar8),(int)uVar10 - (int)uVar8);
    }
    sqlite3ResultStrAccum(local_90,&local_88);
  }
  return;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  size_t i,j;
  sqlite3 *db;
  const char *zFmt;
  sqlite3_str sRes;


  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);

  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    if( zFmt[i]!='%' ) continue;
    if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
    i++;
    j = i + 1;
    switch( zFmt[i] ){
      case 'd': {
        sqlite3_str_appendf(&sRes, "%02d", x.D);
        break;
      }
      case 'f': {
        double s = x.s;
        if( s>59.999 ) s = 59.999;
        sqlite3_str_appendf(&sRes, "%06.3f", s);
        break;
      }
      case 'H': {
        sqlite3_str_appendf(&sRes, "%02d", x.h);
        break;
      }
      case 'W': /* Fall thru */
      case 'j': {
        int nDay;             /* Number of days since 1st day of year */
        DateTime y = x;
        y.validJD = 0;
        y.M = 1;
        y.D = 1;
        computeJD(&y);
        nDay = (int)((x.iJD-y.iJD+43200000)/86400000);
        if( zFmt[i]=='W' ){
          int wd;   /* 0=Monday, 1=Tuesday, ... 6=Sunday */
          wd = (int)(((x.iJD+43200000)/86400000)%7);
          sqlite3_str_appendf(&sRes,"%02d",(nDay+7-wd)/7);
        }else{
          sqlite3_str_appendf(&sRes,"%03d",nDay+1);
        }
        break;
      }
      case 'J': {
        sqlite3_str_appendf(&sRes,"%.16g",x.iJD/86400000.0);
        break;
      }
      case 'm': {
        sqlite3_str_appendf(&sRes,"%02d",x.M);
        break;
      }
      case 'M': {
        sqlite3_str_appendf(&sRes,"%02d",x.m);
        break;
      }
      case 's': {
        i64 iS = (i64)(x.iJD/1000 - 21086676*(i64)10000);
        sqlite3_str_appendf(&sRes,"%lld",iS);
        break;
      }
      case 'S': {
        sqlite3_str_appendf(&sRes,"%02d",(int)x.s);
        break;
      }
      case 'w': {
        sqlite3_str_appendchar(&sRes, 1,
                       (char)(((x.iJD+129600000)/86400000) % 7) + '0');
        break;
      }
      case 'Y': {
        sqlite3_str_appendf(&sRes,"%04d",x.Y);
        break;
      }
      case '%': {
        sqlite3_str_appendchar(&sRes, 1, '%');
        break;
      }
      default: {
        sqlite3_str_reset(&sRes);
        return;
      }
    }
  }
  if( j<i ) sqlite3_str_append(&sRes, zFmt+j, (int)(i-j));
  sqlite3ResultStrAccum(context, &sRes);
}